

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O0

int bmp_create_bw(char *filename,uint32_t w,uint32_t h,uint8_t *data)

{
  uint uVar1;
  uint8_t *data_00;
  FILE *__s;
  int local_54;
  uint local_40;
  uint8_t mask;
  int iStack_3c;
  uint8_t byte;
  int j;
  int i;
  uint8_t *filedata;
  uint32_t filesize;
  int index;
  FILE *f;
  uint8_t *data_local;
  uint32_t h_local;
  uint32_t w_local;
  char *filename_local;
  
  uVar1 = w * h * 3 + 0x36;
  data_00 = (uint8_t *)malloc((ulong)uVar1);
  filedata._4_4_ = create_header(filename,w,h,data_00);
  for (iStack_3c = h - 1; -1 < iStack_3c; iStack_3c = iStack_3c + -1) {
    for (local_40 = 0; local_40 < w; local_40 = local_40 + 1) {
      if ((data[iStack_3c * (w >> 3) + (int)local_40 / 8] &
          (byte)(1 << ((byte)((long)(int)local_40 % 8) & 0x1f))) == 0) {
        data_00[filedata._4_4_] = 0xff;
        data_00[filedata._4_4_ + 1] = 0xff;
        data_00[filedata._4_4_ + 2] = 0xff;
      }
      else {
        data_00[filedata._4_4_] = '\0';
        data_00[filedata._4_4_ + 1] = '\0';
        data_00[filedata._4_4_ + 2] = '\0';
      }
      filedata._4_4_ = filedata._4_4_ + 3;
    }
    if ((w & 3) == 0) {
      local_54 = 0;
    }
    else {
      local_54 = 4 - (w & 3);
    }
    filedata._4_4_ = local_54 + filedata._4_4_;
  }
  __s = fopen(filename,"w");
  fwrite(data_00,1,(ulong)uVar1,__s);
  fclose(__s);
  free(data_00);
  return 0;
}

Assistant:

int bmp_create_bw(char* filename, uint32_t w, uint32_t h, uint8_t* data) {

	FILE *f;
	int index = 0;

	uint32_t filesize = BMP_FILE_HEADER_SIZE + BMP_INFO_HEADER_SIZE + w * h * 3;
	uint8_t* filedata = (uint8_t*)malloc(filesize);

	//Create header
	index += create_header(filename, w, h, filedata);

	//Write data
	for (int i = h - 1; i >= 0; i--) {
		for (int j = 0; j < w; j++) {

			uint8_t byte = data[i * (w / 8) + (j / 8)];
			uint8_t mask = 1 << (j % 8);

			if ((byte & mask) != 0) {
				filedata[index + 0] = 0x00;
				filedata[index + 1] = 0x00;
				filedata[index + 2] = 0x00;
			} else {
				filedata[index + 0] = 0xFF;
				filedata[index + 1] = 0xFF;
				filedata[index + 2] = 0xFF;
			}
			index += 3;
		}

		//Padding should ensure each section is word aligned
		//TODO: this is broken
		index += (w % 4 != 0) ? 4 - (w % 4) : 0;
	}

	//Write file
	f = fopen(filename, "w");
	fwrite(filedata, 1, filesize, f);
	fclose(f);

	free(filedata);

	return 0;
}